

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::utp_socket_impl::resend_packet(utp_socket_impl *this,packet *p,bool fast_resend)

{
  ushort uVar1;
  utp_socket_manager *this_00;
  packet *ppVar2;
  packet *ppVar3;
  bool bVar4;
  unsigned_short uVar5;
  int iVar6;
  int *piVar7;
  rep rVar8;
  duration td;
  int64_t iVar9;
  uint8_t *p_00;
  bool local_101;
  error_code local_c8;
  error_code local_b8 [2];
  udp_send_flags_t local_95;
  basic_endpoint<boost::asio::ip::udp> local_94;
  weak_ptr<libtorrent::aux::utp_socket_interface> local_78;
  undefined1 local_68 [8];
  error_code ec;
  int sack_size;
  uint8_t *ptr;
  utp_header *h;
  int local_28;
  byte local_21;
  int window_size_left;
  bool fast_resend_local;
  packet *p_local;
  utp_socket_impl *this_local;
  
  local_21 = fast_resend;
  _window_size_left = p;
  p_local = (packet *)this;
  bVar4 = boost::system::error_code::operator_cast_to_bool(&this->m_error);
  if (bVar4) {
    this_local._7_1_ = false;
  }
  else if ((*(ushort *)&this->field_0x21c >> 0xe & 1) == 0) {
    if (((uint16_t)(this->m_acked_seq_nr + 1) == this->m_mtu_seq) && (this->m_mtu_seq != 0)) {
      this->m_mtu_seq = 0;
      _window_size_left->field_0xe = _window_size_left->field_0xe & 0x7f;
      this->m_mtu_ceiling = _window_size_left->size - 1;
      update_mtu_limits(this);
    }
    h._4_4_ = (undefined4)((ulong)this->m_cwnd >> 0x10);
    h._0_4_ = this->m_adv_wnd;
    piVar7 = ::std::min<int>((int *)((long)&h + 4),(int *)&h);
    local_28 = *piVar7 - this->m_bytes_in_flight;
    if ((((local_21 & 1) == 0) &&
        (local_28 < (int)((uint)_window_size_left->size - (uint)_window_size_left->header_size))) &&
       (0 < this->m_bytes_in_flight)) {
      *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0xfbff | 0x400;
      this_local._7_1_ = false;
    }
    else {
      if (((byte)_window_size_left->field_0xe >> 6 & 1) != 0) {
        this->m_bytes_in_flight =
             ((uint)_window_size_left->size - (uint)_window_size_left->header_size) +
             this->m_bytes_in_flight;
      }
      utp_socket_manager::inc_stats_counter(this->m_sm,0xa8,1);
      if ((local_21 & 1) != 0) {
        utp_socket_manager::inc_stats_counter(this->m_sm,0xa7,1);
      }
      ppVar2 = _window_size_left;
      _window_size_left->field_0xe = _window_size_left->field_0xe & 0xbf;
      big_endian_int<unsigned_int>::operator=
                ((big_endian_int<unsigned_int> *)((long)&_window_size_left[1].send_time.__d.__r + 7)
                 ,this->m_reply_micro);
      rVar8 = ::std::chrono::_V2::system_clock::now();
      (_window_size_left->send_time).__d.__r = rVar8;
      td = ::std::chrono::
           time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           ::time_since_epoch(&_window_size_left->send_time);
      iVar9 = total_microseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_>)td.__r);
      big_endian_int<unsigned_int>::operator=
                ((big_endian_int<unsigned_int> *)((long)&ppVar2[1].send_time.__d.__r + 3),
                 (uint)iVar9);
      if (((char)ppVar2[1].send_time.__d.__r == '\x01') &&
         (uVar5 = big_endian_int::operator_cast_to_unsigned_short
                            ((big_endian_int *)((long)&ppVar2[2].send_time.__d.__r + 1)),
         ppVar3 = _window_size_left, uVar5 != this->m_ack_nr)) {
        ec.cat_._4_4_ = (uint)*(byte *)((long)&_window_size_left[2].send_time.__d.__r + 4);
        iVar6 = packet_buffer::size(&this->m_inbuf);
        if (iVar6 == 0) {
          remove_sack_header(this,_window_size_left);
        }
        else {
          write_sack(this,(uint8_t *)((long)&ppVar3[2].send_time.__d.__r + 5),ec.cat_._4_4_);
        }
      }
      big_endian_int<unsigned_short>::operator=
                ((big_endian_int<unsigned_short> *)((long)&ppVar2[2].send_time.__d.__r + 1),
                 this->m_ack_nr);
      boost::system::error_code::error_code((error_code *)local_68);
      this_00 = this->m_sm;
      ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::weak_ptr(&local_78,&this->m_sock);
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
                (&local_94,&this->m_remote_address,this->m_port);
      p_00 = _window_size_left->buf;
      uVar1 = _window_size_left->size;
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>::
      bitfield_flag(&local_95);
      utp_socket_manager::send_packet
                (this_00,&local_78,&local_94,(char *)p_00,(uint)uVar1,(error_code *)local_68,
                 local_95);
      ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::~weak_ptr(&local_78);
      boost::system::error_code::error_code<boost::asio::error::basic_errors>
                (local_b8,try_again,(type *)0x0);
      bVar4 = boost::system::operator==((error_code *)local_68,local_b8);
      local_101 = true;
      if (!bVar4) {
        boost::system::error_code::error_code<boost::asio::error::basic_errors>
                  (&local_c8,try_again,(type *)0x0);
        local_101 = boost::system::operator==((error_code *)local_68,&local_c8);
      }
      if (local_101 == false) {
        bVar4 = boost::system::error_code::operator_cast_to_bool((error_code *)local_68);
        if (bVar4) {
          (this->m_error).val_ = local_68._0_4_;
          (this->m_error).failed_ = (bool)local_68[4];
          *(undefined3 *)&(this->m_error).field_0x5 = local_68._5_3_;
          (this->m_error).cat_ = (error_category *)ec._0_8_;
          set_state(this,error_wait);
          test_socket_state(this);
          return false;
        }
        utp_socket_manager::inc_stats_counter(this->m_sm,0xa6,1);
        this->m_out_packets = this->m_out_packets + 1;
        _window_size_left->field_0xe =
             _window_size_left->field_0xe & 0xc0 | (_window_size_left->field_0xe & 0x3f) + 1 & 0x3f;
      }
      else {
        *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0xbfff | 0x4000;
        utp_socket_manager::subscribe_writable(this->m_sm,this);
        _window_size_left->field_0xe = _window_size_left->field_0xe & 0xbf | 0x40;
        this->m_bytes_in_flight =
             this->m_bytes_in_flight -
             ((uint)_window_size_left->size - (uint)_window_size_left->header_size);
      }
      this_local._7_1_ =
           (bool)(((byte)((ushort)*(undefined2 *)&this->field_0x21c >> 0xe) & 1 ^ 0xff) & 1);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool utp_socket_impl::resend_packet(packet* p, bool fast_resend)
{
	INVARIANT_CHECK;

	// for fast re-sends the packet hasn't been marked as needing resending
	TORRENT_ASSERT(p->need_resend || fast_resend);

	if (m_error) return false;
	if (m_stalled) return false;

	if (((m_acked_seq_nr + 1) & ACK_MASK) == m_mtu_seq
		&& m_mtu_seq != 0)
	{
		m_mtu_seq = 0;
		p->mtu_probe = false;
		// we got multiple acks for the packet before our probe, assume
		// it was dropped because it was too big
		m_mtu_ceiling = p->size - 1;
		update_mtu_limits();
	}

	// we can only resend the packet if there's
	// enough space in our congestion window
	// since we can't re-packetize, some packets that are
	// larger than the congestion window must be allowed through
	// but only if we don't have any outstanding bytes
	int const window_size_left = std::min(int(m_cwnd >> 16), int(m_adv_wnd)) - m_bytes_in_flight;
	if (!fast_resend
		&& p->size - p->header_size > window_size_left
		&& m_bytes_in_flight > 0)
	{
		m_cwnd_full = true;
		return false;
	}

	// plus one since we have fast-resend as well, which doesn't
	// necessarily trigger by a timeout
	// the fast-resend path does not check for too many resends, that's only in
	// the time-out path
	TORRENT_ASSERT_VAL(fast_resend || p->num_transmissions < m_sm.num_resends() + 1, m_sm.num_resends());

	TORRENT_ASSERT(p->size - p->header_size >= 0);
	if (p->need_resend) m_bytes_in_flight += p->size - p->header_size;

	m_sm.inc_stats_counter(counters::utp_packet_resend);
	if (fast_resend) m_sm.inc_stats_counter(counters::utp_fast_retransmit);

#if TORRENT_USE_ASSERTS
	if (fast_resend) ++p->num_fast_resend;
#endif
	p->need_resend = false;
	auto* h = reinterpret_cast<utp_header*>(p->buf);
	// update packet header
	h->timestamp_difference_microseconds = m_reply_micro;
	p->send_time = clock_type::now();
	h->timestamp_microseconds = std::uint32_t(
		total_microseconds(p->send_time.time_since_epoch()) & 0xffffffff);

	// if the packet has a selective ack header, we'll need
	// to update it
	if (h->extension == utp_sack && h->ack_nr != m_ack_nr)
	{
		std::uint8_t* ptr = p->buf + sizeof(utp_header);
		int sack_size = ptr[1];
		if (m_inbuf.size())
		{
			// update the sack header
			write_sack(ptr + 2, sack_size);
			TORRENT_ASSERT(ptr + sack_size + 2 <= p->buf + p->header_size);
		}
		else
		{
			remove_sack_header(p);
		}
	}

	h->ack_nr = m_ack_nr;

	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(p->buf), p->size, ec);

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: re-sending packet seq_nr:%d ack_nr:%d type:%s "
		"id:%d target:%s size:%d error:%s send_buffer_size:%d cwnd:%d "
		"adv_wnd:%d in-flight:%d mtu:%d timestamp:%u time_diff:%d\n"
		, static_cast<void*>(this), int(h->seq_nr), int(h->ack_nr), packet_type_names[h->get_type()]
		, m_send_id, print_endpoint(udp::endpoint(m_remote_address, m_port)).c_str()
		, p->size, ec.message().c_str(), m_write_buffer_size, int(m_cwnd >> 16)
		, m_adv_wnd, m_bytes_in_flight, m_mtu, std::uint32_t(h->timestamp_microseconds)
		, std::uint32_t(h->timestamp_difference_microseconds));
#endif

	if (ec == error::would_block || ec == error::try_again)
	{
#if TORRENT_UTP_LOG
		UTP_LOGV("%8p: socket stalled\n", static_cast<void*>(this));
#endif
		TORRENT_ASSERT(!m_stalled);
		m_stalled = true;
		m_sm.subscribe_writable(this);
		p->need_resend = true;
		m_bytes_in_flight -= p->size - p->header_size;
	}
	else if (ec)
	{
		m_error = ec;
		set_state(state_t::error_wait);
		test_socket_state();
		return false;
	}
	else
	{
		m_sm.inc_stats_counter(counters::utp_packets_out);
		++m_out_packets;
		++p->num_transmissions;
	}

	return !m_stalled;
}